

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

block * lsvm::object::find_method(object_class *cls,symbol *name)

{
  entry *peVar1;
  long in_RDI;
  entry *e;
  long local_10;
  
  local_10 = in_RDI;
  do {
    peVar1 = hashmap::get((hashmap *)cls,name);
    if (peVar1 != (entry *)0x0) {
      return (block *)peVar1->val;
    }
    local_10 = *(long *)(local_10 + 0x10);
  } while (local_10 != 0);
  return (block *)0x0;
}

Assistant:

block* find_method(object_class* cls, symbol* name){
    do {
        lsvm::hashmap::entry* e = lsvm::hashmap::get(cls->methods,name);
        if(e == null){
            cls = cls->super;
        }else{
            return (block*)e->val;
        }
    }while(cls != null);
    
    return null;    
}